

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O0

bool dxil_spv::emit_load_input_instruction(Impl *impl,CallInst *instruction)

{
  Id resultId;
  Builder *this;
  CallInst *pCVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  Id IVar5;
  ClipCullMeta *meta_00;
  mapped_type *meta_01;
  size_type sVar6;
  Operation *pOVar7;
  Value *pVVar8;
  Operation *op;
  Id load_type;
  Value *index;
  Operation *op_1;
  uint32_t num_cols;
  bool row_index;
  Id IStack_48;
  bool array_index;
  Id input_type_id;
  uint32_t ptr_id;
  uint32_t var_id;
  mapped_type *meta;
  ClipCullMeta *clip_cull_meta;
  Builder *pBStack_28;
  uint32_t input_element_index;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  
  builder = (Builder *)instruction;
  instruction_local = (CallInst *)impl;
  pBStack_28 = Converter::Impl::builder(impl);
  bVar2 = get_constant_operand((Instruction *)builder,1,(uint32_t *)((long)&clip_cull_meta + 4));
  if (bVar2) {
    meta_00 = input_clip_cull_distance_meta((Impl *)instruction_local,clip_cull_meta._4_4_);
    if (meta_00 == (ClipCullMeta *)0x0) {
      meta_01 = std::
                unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ElementMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementMeta>_>_>
                ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ElementMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementMeta>_>_>
                              *)&instruction_local[0x12].super_Instruction.attachments._M_h.
                                 _M_rehash_policy._M_next_resize,
                             (key_type *)((long)&clip_cull_meta + 4));
      resultId = meta_01->id;
      num_cols = spv::Builder::getDerefTypeId(pBStack_28,resultId);
      bVar2 = false;
      if (((((int)instruction_local[1].super_Instruction.attachments._M_h._M_rehash_policy.
                  _M_next_resize == 1) ||
           ((int)instruction_local[1].super_Instruction.attachments._M_h._M_rehash_policy.
                 _M_next_resize == 3)) ||
          ((int)instruction_local[1].super_Instruction.attachments._M_h._M_rehash_policy.
                _M_next_resize == 2)) ||
         (sVar6 = std::
                  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                  ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                           *)&instruction_local[5].super_Instruction.attachments._M_h.
                              _M_before_begin,(key_type *)((long)&clip_cull_meta + 4)), sVar6 != 0))
      {
        num_cols = spv::Builder::getContainedTypeId(pBStack_28,num_cols);
        bVar2 = true;
      }
      bVar3 = spv::Builder::isArrayType(pBStack_28,num_cols);
      if (bVar3) {
        num_cols = spv::Builder::getContainedTypeId(pBStack_28,num_cols);
      }
      uVar4 = spv::Builder::getNumTypeComponents(pBStack_28,num_cols);
      pCVar1 = instruction_local;
      this = pBStack_28;
      if (((1 < uVar4) || (bVar3)) || (IStack_48 = resultId, bVar2)) {
        IVar5 = Converter::Impl::get_effective_input_output_type_id
                          ((Impl *)instruction_local,meta_01->component_type);
        IVar5 = spv::Builder::makePointer(this,StorageClassInput,IVar5);
        pOVar7 = Converter::Impl::allocate((Impl *)pCVar1,OpAccessChain,IVar5);
        IStack_48 = pOVar7->id;
        Operation::add_id(pOVar7,resultId);
        if (bVar2) {
          pVVar8 = LLVMBC::Instruction::getOperand((Instruction *)builder,4);
          bVar2 = LLVMBC::isa<LLVMBC::UndefValue>(pVVar8);
          if (bVar2) {
            IVar5 = spv::Builder::makeUintConstant(pBStack_28,0,false);
            Operation::add_id(pOVar7,IVar5);
          }
          else {
            IVar5 = Converter::Impl::get_id_for_value((Impl *)instruction_local,pVVar8,0);
            Operation::add_id(pOVar7,IVar5);
          }
        }
        pCVar1 = instruction_local;
        if (bVar3) {
          pVVar8 = LLVMBC::Instruction::getOperand((Instruction *)builder,2);
          IVar5 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar8,0);
          Operation::add_id(pOVar7,IVar5);
        }
        pCVar1 = instruction_local;
        if (1 < uVar4) {
          pVVar8 = LLVMBC::Instruction::getOperand((Instruction *)builder,3);
          IVar5 = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar8,0x20);
          Operation::add_id(pOVar7,IVar5);
        }
        Converter::Impl::add((Impl *)instruction_local,pOVar7,false);
      }
      IVar5 = get_builtin_load_type((Impl *)instruction_local,meta_01);
      pOVar7 = Converter::Impl::allocate((Impl *)instruction_local,OpLoad,(Value *)builder,IVar5);
      Operation::add_id(pOVar7,IStack_48);
      Converter::Impl::add((Impl *)instruction_local,pOVar7,false);
      fixup_builtin_load((Impl *)instruction_local,resultId,(CallInst *)builder);
      Converter::Impl::fixup_load_type_io
                ((Impl *)instruction_local,meta_01->component_type,1,(Value *)builder);
      impl_local._7_1_ = true;
    }
    else {
      impl_local._7_1_ =
           emit_load_clip_cull_distance((Impl *)instruction_local,(CallInst *)builder,meta_00);
    }
  }
  else {
    impl_local._7_1_ = false;
  }
  return impl_local._7_1_;
}

Assistant:

bool emit_load_input_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	uint32_t input_element_index;
	if (!get_constant_operand(instruction, 1, &input_element_index))
		return false;

	// Need special handling for clip distance.
	auto *clip_cull_meta = input_clip_cull_distance_meta(impl, input_element_index);
	if (clip_cull_meta)
		return emit_load_clip_cull_distance(impl, instruction, *clip_cull_meta);

	const auto &meta = impl.input_elements_meta[input_element_index];
	uint32_t var_id = meta.id;
	uint32_t ptr_id;

	spv::Id input_type_id = builder.getDerefTypeId(var_id);

	bool array_index = false;
	if (impl.execution_model == spv::ExecutionModelTessellationControl ||
	    impl.execution_model == spv::ExecutionModelGeometry ||
	    impl.execution_model == spv::ExecutionModelTessellationEvaluation ||
	    impl.llvm_attribute_at_vertex_indices.count(input_element_index) != 0)
	{
		input_type_id = builder.getContainedTypeId(input_type_id);
		array_index = true;
	}

	bool row_index = false;
	if (builder.isArrayType(input_type_id))
	{
		row_index = true;
		input_type_id = builder.getContainedTypeId(input_type_id);
	}

	uint32_t num_cols = builder.getNumTypeComponents(input_type_id);

	if (num_cols > 1 || row_index || array_index)
	{
		// Need to deal with signed vs unsigned here.
		Operation *op =
			impl.allocate(spv::OpAccessChain,
			              builder.makePointer(spv::StorageClassInput,
			                                  impl.get_effective_input_output_type_id(meta.component_type)));
		ptr_id = op->id;

		op->add_id(var_id);
		// Vertex array index for GS/DS/HS or barycentrics.
		if (array_index)
		{
			auto *index = instruction->getOperand(4);
			if (llvm::isa<llvm::UndefValue>(index))
			{
				// If we loadInput on a barycentric input, we get nointerpolation,
				// i.e. flat, i.e. provoking vertex, i.e. vertex 0.
				op->add_id(builder.makeUintConstant(0));
			}
			else
				op->add_id(impl.get_id_for_value(index));
		}
		if (row_index)
			op->add_id(impl.get_id_for_value(instruction->getOperand(2)));
		if (num_cols > 1)
			op->add_id(impl.get_id_for_value(instruction->getOperand(3), 32));

		impl.add(op);
	}
	else
		ptr_id = var_id;

	// Need to deal with signed vs unsigned here.
	spv::Id load_type = get_builtin_load_type(impl, meta);

	Operation *op = impl.allocate(spv::OpLoad, instruction, load_type);
	op->add_id(ptr_id);
	impl.add(op);

	fixup_builtin_load(impl, var_id, instruction);

	// Need to bitcast after we load.
	impl.fixup_load_type_io(meta.component_type, 1, instruction);
	return true;
}